

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_descriptor_combo
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  _Bool _Var1;
  int iVar2;
  
  _Var1 = has_uncompressed_key_by_child(node);
  if (_Var1) {
    iVar2 = generate_by_descriptor_pkh(node,parent,derive_child_num,script,script_len,write_len);
    return iVar2;
  }
  iVar2 = generate_by_descriptor_wpkh(node,parent,derive_child_num,script,script_len,write_len);
  return iVar2;
}

Assistant:

static int generate_by_descriptor_combo(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    if (has_uncompressed_key_by_child(node)) {
        return generate_by_descriptor_pkh(
            node, parent, derive_child_num, script, script_len, write_len);
    } else {
        return generate_by_descriptor_wpkh(
            node, parent, derive_child_num, script, script_len, write_len);
    }
}